

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  ulong osize;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  
  pMVar1 = ls->buff;
  sVar4 = pMVar1->n;
  osize = pMVar1->buffsize;
  uVar3 = sVar4 + 1;
  if (osize < uVar3) {
    if (0x5555555555555553 < osize) {
      lexerror(ls,"lexical element too long",0);
    }
    sVar4 = (osize >> 1) + osize;
    pcVar2 = (char *)luaM_saferealloc_(ls->L,pMVar1->buffer,osize,sVar4);
    pMVar1->buffer = pcVar2;
    pMVar1->buffsize = sVar4;
    sVar4 = pMVar1->n;
    uVar3 = sVar4 + 1;
  }
  else {
    pcVar2 = pMVar1->buffer;
  }
  pMVar1->n = uVar3;
  pcVar2[sVar4] = (char)c;
  return;
}

Assistant:

static void save (LexState *ls, int c) {
  Mbuffer *b = ls->buff;
  if (luaZ_bufflen(b) + 1 > luaZ_sizebuffer(b)) {
    size_t newsize = luaZ_sizebuffer(b);  /* get old size */;
    if (newsize >= (MAX_SIZE/3 * 2))  /* larger than MAX_SIZE/1.5 ? */
      lexerror(ls, "lexical element too long", 0);
    newsize += (newsize >> 1);  /* new size is 1.5 times the old one */
    luaZ_resizebuffer(ls->L, b, newsize);
  }
  b->buffer[luaZ_bufflen(b)++] = cast_char(c);
}